

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconnect.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  ostream *poVar1;
  DashelException *e;
  allocator<char> local_d9;
  string local_d8;
  undefined1 local_b8 [8];
  ReconnectingHub reconnectingHub;
  char **argv_local;
  int argc_local;
  
  reconnectingHub.target.field_2._8_8_ = argv;
  if (1 < argc) {
    __s = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,__s,&local_d9);
    ReconnectingHub::ReconnectingHub((ReconnectingHub *)local_b8,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator(&local_d9);
    do {
      ReconnectingHub::stepAndReconnect((ReconnectingHub *)local_b8);
    } while( true );
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage ");
  poVar1 = std::operator<<(poVar1,*(char **)reconnectingHub.target.field_2._8_8_);
  poVar1 = std::operator<<(poVar1," target");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
	try
	{
		if (argc > 1)
		{
			ReconnectingHub reconnectingHub(argv[1]);
			while (true)
			{
				reconnectingHub.stepAndReconnect();
			}
		}
		else
		{
			cerr << "Usage " << argv[0] << " target" << endl;
			return 1;
		}
	}
	catch (const DashelException& e)
	{
		cerr << e.what() << endl;
	}

	return 0;
}